

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall
Js::InlineCache::CacheProto
          (InlineCache *this,DynamicObject *prototypeObjectWithProperty,PropertyId propertyId,
          PropertyIndex propertyIndex,bool isInlineSlot,bool isMissing,Type *type,
          ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  PropertyRecord *pPVar6;
  
  if (prototypeObjectWithProperty == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x55,"(prototypeObjectWithProperty)","prototypeObjectWithProperty")
    ;
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x56,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  if (propertyIndex == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x57,"(propertyIndex != Constants::NoSlot)",
                                "propertyIndex != Constants::NoSlot");
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x58,"(type)","type");
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x59,"(requestContext)","requestContext");
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  if ((((((prototypeObjectWithProperty->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != requestContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x5a,
                                "(prototypeObjectWithProperty->GetScriptContext() == requestContext)"
                                ,"prototypeObjectWithProperty->GetScriptContext() == requestContext"
                               );
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  VerifyRegistrationForInvalidation(this,requestContext,propertyId);
  if (((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x1) !=
       (undefined1  [24])0x0) && ((this->u).local.typeWithoutProperty != (Type *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x66,"(!IsLocal() || u.local.typeWithoutProperty == nullptr)",
                                "!IsLocal() || u.local.typeWithoutProperty == nullptr");
    if (!bVar3) goto LAB_00894fb6;
    *puVar4 = 0;
  }
  requestContext->hasUsedInlineCache = true;
  Memory::InlineCacheAllocator::Unlock(&requestContext->inlineCacheAllocator);
  if (this->invalidationListSlotPtr == (InlineCache **)0x0) {
    ScriptContext::RegisterProtoInlineCache(requestContext,this,propertyId);
  }
  (this->u).proto.prototypeObject = prototypeObjectWithProperty;
  *(ushort *)&this->u = ((ushort)*(undefined4 *)&this->u & 0xfffc) + (ushort)isMissing * 2 + 1;
  (this->u).proto.slotIndex = propertyIndex;
  pTVar5 = (Type *)((ulong)type | 4);
  if (isInlineSlot) {
    pTVar5 = type;
  }
  (this->u).local.typeWithoutProperty = pTVar5;
  pTVar1 = &((prototypeObjectWithProperty->super_RecyclableObject).type.ptr)->flags;
  *pTVar1 = *pTVar1 | TypeFlagMask_HasBeenCached;
  VerifyRegistrationForInvalidation(this,requestContext,propertyId);
  if (((undefined1  [24])((undefined1  [24])this->u & (undefined1  [24])0x2) ==
      (undefined1  [24])0x0) ==
      ((this->u).proto.prototypeObject ==
      (((requestContext->super_ScriptContextBase).javascriptLibrary)->missingPropertyHolder).ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x81,
                                "(u.proto.isMissing == (uint16)(u.proto.prototypeObject == requestContext->GetLibrary()->GetMissingPropertyHolder()))"
                                ,
                                "u.proto.isMissing == (uint16)(u.proto.prototypeObject == requestContext->GetLibrary()->GetMissingPropertyHolder())"
                               );
    if (!bVar3) {
LAB_00894fb6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
  if ((bVar3) && (DAT_0145948a == '\x01')) {
    pPVar6 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"IC::CacheProto, %s: ",pPVar6 + 1);
    Dump(this);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void InlineCache::CacheProto(
        DynamicObject *const prototypeObjectWithProperty,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        const bool isMissing,
        Type *const type,
        ScriptContext *const requestContext)
    {
        Assert(prototypeObjectWithProperty);
        Assert(propertyId != Constants::NoProperty);
        Assert(propertyIndex != Constants::NoSlot);
        Assert(type);
        Assert(requestContext);
        Assert(prototypeObjectWithProperty->GetScriptContext() == requestContext);
        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));

        // This is an interesting quirk.  In the browser Chakra's global object cannot be used directly as a prototype, because
        // the global object (referenced either as window or as this) always points to the host object.  Thus, when we retrieve
        // a property from Chakra's global object the prototypeObjectWithProperty != info->GetInstance() and we will never cache
        // such property loads (see CacheOperators::CachePropertyRead).  However, in jc.exe or jshost.exe the only global object
        // is Chakra's global object, and so prototypeObjectWithProperty == info->GetInstance() and we can cache.  Hence, the
        // assert below is only correct when running in the browser.
        // Assert(prototypeObjectWithProperty != prototypeObjectWithProperty->type->GetLibrary()->GetGlobalObject());

        // Store field and load field caches are never shared so we should never have an add property cache morphing into a prototype cache.
        Assert(!IsLocal() || u.local.typeWithoutProperty == nullptr);

        requestContext->SetHasUsedInlineCache(true);

        // Add cache into a proto cache list if not there yet.
        if (invalidationListSlotPtr == nullptr)
        {
            // Note, this can throw due to OOM, so we need to do it before the inline cache is set below.
            requestContext->RegisterProtoInlineCache(this, propertyId);
        }

        u.proto.prototypeObject = prototypeObjectWithProperty;
        u.proto.isProto = true;
        u.proto.isMissing = isMissing;
        u.proto.slotIndex = propertyIndex;
        if (isInlineSlot)
        {
            u.proto.type = type;
        }
        else
        {
            u.proto.type = TypeWithAuxSlotTag(type);
        }

        prototypeObjectWithProperty->GetType()->SetHasBeenCached();

        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));
        Assert(u.proto.isMissing == (uint16)(u.proto.prototypeObject == requestContext->GetLibrary()->GetMissingPropertyHolder()));

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            Output::Print(_u("IC::CacheProto, %s: "), requestContext->GetPropertyName(propertyId)->GetBuffer());
            Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }